

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

_Bool borg_flow_far_from_stairs_dist(wchar_t x,wchar_t y,wchar_t b_stair,wchar_t distance)

{
  wchar_t wVar1;
  wchar_t cost;
  wchar_t distance_local;
  wchar_t b_stair_local;
  wchar_t y_local;
  wchar_t x_local;
  
  if (((borg.trait[0x69] < borg.trait[0x23] + -5) || (0x13 < borg.trait[0x23])) ||
     (wVar1 = borg_flow_cost_stair(y,x,b_stair), wVar1 <= distance)) {
    y_local._3_1_ = false;
  }
  else {
    y_local._3_1_ = true;
  }
  return y_local._3_1_;
}

Assistant:

bool borg_flow_far_from_stairs_dist(int x, int y, int b_stair, int distance)
{
    if (borg.trait[BI_CDEPTH] >= borg.trait[BI_CLEVEL] - 5
        && borg.trait[BI_CLEVEL] < 20) {

        /* obtain the number of steps from this take to the stairs */
        int cost = borg_flow_cost_stair(y, x, b_stair);

        /* Check the distance to stair for this proposed grid */
        if (cost > distance)
            return true;
    }

    return false;
}